

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# none.hpp
# Opt level: O1

string * __thiscall
websocketpp::transport::asio::basic_socket::connection::get_remote_endpoint_abi_cxx11_
          (string *__return_storage_ptr__,connection *this,error_code *ec)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  error_category *peVar5;
  ostream *poVar6;
  error_code aec;
  endpoint ep;
  stringstream s;
  error_code local_1f8;
  char local_1e8;
  undefined7 uStack_1e7;
  long local_1e0;
  long local_1d8 [2];
  endpoint_type local_1c4;
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  char *__s;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1f8.val_ = 0;
  local_1f8._4_4_ = local_1f8._4_4_ & 0xffffff00;
  local_1f8.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  peVar1 = (this->m_socket).
           super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::remote_endpoint
            (&local_1c4,
             (peVar1->
             super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ).impl_.service_,
             &(peVar1->
              super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ).impl_.implementation_,&local_1f8);
  if (local_1f8.failed_ == true) {
    if (error::get_category()::instance == '\0') {
      get_remote_endpoint_abi_cxx11_();
    }
    ec->_M_value = 3;
    ec->_M_cat = (error_category *)&error::get_category()::instance;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Error getting remote endpoint: ",0x1f);
    iVar2 = local_1f8.val_;
    iVar3 = (**((error_category *)&(local_1f8.cat_)->_vptr_error_category)->_vptr_error_category)();
    __s = (char *)CONCAT44(extraout_var,iVar3);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar4);
    }
    local_1e8 = ':';
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1e8,1);
    std::ostream::operator<<((ostream *)poVar6,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," (",2);
    (*((error_category *)&(local_1f8.cat_)->_vptr_error_category)->_vptr_error_category[4])
              (&local_1e8,local_1f8.cat_,(ulong)(uint)local_1f8.val_);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(char *)CONCAT71(uStack_1e7,local_1e8),local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    if ((long *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
      operator_delete((long *)CONCAT71(uStack_1e7,local_1e8),local_1d8[0] + 1);
    }
  }
  else {
    peVar5 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar5;
    boost::asio::ip::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)local_198,&local_1c4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string get_remote_endpoint(lib::error_code & ec) const {
        std::stringstream s;

        lib::asio::error_code aec;
        lib::asio::ip::tcp::endpoint ep = m_socket->remote_endpoint(aec);

        if (aec) {
            ec = error::make_error_code(error::pass_through);
            s << "Error getting remote endpoint: " << aec
               << " (" << aec.message() << ")";
            return s.str();
        } else {
            ec = lib::error_code();
            s << ep;
            return s.str();
        }
    }